

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_bitmap_operation.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint8_t uVar2;
  string *message;
  ostream *this;
  long in_RSI;
  int in_EDI;
  exception *ex;
  uint8_t thresholdValue;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  Image image;
  string filePath;
  string *in_stack_00000318;
  ImageTemplate<unsigned_char> *in_stack_fffffffffffffe58;
  undefined7 in_stack_fffffffffffffe60;
  uint8_t in_stack_fffffffffffffe67;
  Image *in_stack_fffffffffffffe68;
  string *in_stack_fffffffffffffe70;
  imageException *this_00;
  allocator local_149;
  string local_148 [79];
  uint8_t local_f9;
  undefined1 local_b2;
  undefined1 local_b1 [65];
  ImageTemplate<unsigned_char> local_70;
  allocator local_31;
  string local_30 [32];
  long local_10;
  int local_8;
  int local_4;
  
  local_4 = 0;
  local_10 = in_RSI;
  local_8 = in_EDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_30,"lena.bmp",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  if (1 < local_8) {
    std::__cxx11::string::operator=(local_30,*(char **)(local_10 + 8));
  }
  Bitmap_Operation::Load(in_stack_00000318);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::empty(&local_70);
  if (!bVar1) {
    uVar2 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(&local_70);
    if (uVar2 != '\x01') {
      Image_Function::ConvertToGrayScale(in_stack_fffffffffffffe58);
      PenguinV_Image::ImageTemplate<unsigned_char>::operator=
                ((ImageTemplate<unsigned_char> *)
                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
                 in_stack_fffffffffffffe58);
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)0x1037c2);
    }
    Image_Function::Histogram(in_stack_fffffffffffffe58);
    local_f9 = Image_Function::GetThreshold
                         ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x10380e);
    Image_Function::Threshold(in_stack_fffffffffffffe68,in_stack_fffffffffffffe67);
    PenguinV_Image::ImageTemplate<unsigned_char>::operator=
              ((ImageTemplate<unsigned_char> *)
               CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60),
               in_stack_fffffffffffffe58);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x103862);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_148,"result.bmp",&local_149);
    Bitmap_Operation::Save(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    std::__cxx11::string::~string(local_148);
    std::allocator<char>::~allocator((allocator<char> *)&local_149);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffe70);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)0x1038cb);
    this = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    local_4 = 0;
    std::__cxx11::string::~string(local_30);
    return local_4;
  }
  local_b2 = 1;
  message = (string *)__cxa_allocate_exception(0x28);
  this_00 = (imageException *)local_b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_b1 + 1),"Cannot load ",(allocator *)this_00);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe68,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffe67,in_stack_fffffffffffffe60));
  imageException::imageException(this_00,message);
  local_b2 = 0;
  __cxa_throw(message,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "lena.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load an image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Save result
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}